

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtils.cpp
# Opt level: O0

tm * ApprovalTests::DateUtils::toUtc(time_t *tt)

{
  tm *__src;
  time_t *in_RSI;
  tm *in_RDI;
  tm *tm_value;
  
  __src = gmtime(in_RSI);
  memcpy(in_RDI,__src,0x38);
  return in_RDI;
}

Assistant:

tm DateUtils::toUtc(time_t& tt)
    {
#ifdef _MSC_VER // Visual Studio compiler
        std::tm tm_value = {};
        gmtime_s(&tm_value, &tt);
#else
        tm tm_value = *gmtime(&tt);
#endif
        return tm_value;
    }